

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_adj.c
# Opt level: O2

REF_STATUS ref_adj_tec_fill(REF_ADJ ref_adj,char *filename)

{
  uint uVar1;
  REF_STATUS RVar2;
  FILE *__s;
  ulong uVar3;
  ulong uVar4;
  REF_ADJ_ITEM pRVar5;
  ulong uVar6;
  
  __s = fopen(filename,"w");
  if (__s == (FILE *)0x0) {
    printf("unable to open %s\n",filename);
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adj.c",0xf7,
           "ref_adj_tec_fill","unable to open file");
    RVar2 = 2;
  }
  else {
    fwrite("title=\"tecplot refine adj fill\"\n",0x20,1,__s);
    fwrite("variables = \"item\" \"node\"\n",0x1a,1,__s);
    uVar3 = 0;
    uVar6 = (ulong)(uint)ref_adj->nnode;
    if (ref_adj->nnode < 1) {
      uVar6 = uVar3;
    }
    uVar4 = 0;
    for (; uVar3 != uVar6; uVar3 = uVar3 + 1) {
      for (pRVar5 = (REF_ADJ_ITEM)(ref_adj->first + uVar3); (long)pRVar5->next != -1;
          pRVar5 = ref_adj->item + pRVar5->next) {
        uVar4 = (ulong)((int)uVar4 + 1);
      }
    }
    fprintf(__s,"zone t=\"fill\", i=%d, datapacking=%s\n",uVar4,"point");
    for (uVar6 = 0; (long)uVar6 < (long)ref_adj->nnode; uVar6 = uVar6 + 1) {
      pRVar5 = (REF_ADJ_ITEM)(ref_adj->first + uVar6);
      while( true ) {
        uVar1 = pRVar5->next;
        if ((long)(int)uVar1 == -1) break;
        fprintf(__s," %d %d\n",(ulong)uVar1,uVar6 & 0xffffffff);
        pRVar5 = ref_adj->item + (int)uVar1;
      }
    }
    fclose(__s);
    RVar2 = 0;
  }
  return RVar2;
}

Assistant:

REF_FCN REF_STATUS ref_adj_tec_fill(REF_ADJ ref_adj, const char *filename) {
  REF_INT node, item, nadj;

  FILE *file;

  file = fopen(filename, "w");
  if (NULL == (void *)file) printf("unable to open %s\n", filename);
  RNS(file, "unable to open file");

  fprintf(file, "title=\"tecplot refine adj fill\"\n");
  fprintf(file, "variables = \"item\" \"node\"\n");

  nadj = 0;
  for (node = 0; node < ref_adj_nnode(ref_adj); node++) {
    each_ref_adj_node_item(ref_adj, node, item) { nadj++; }
  }

  fprintf(file, "zone t=\"fill\", i=%d, datapacking=%s\n", nadj, "point");

  for (node = 0; node < ref_adj_nnode(ref_adj); node++) {
    each_ref_adj_node_item(ref_adj, node, item) {
      fprintf(file, " %d %d\n", item, node);
    }
  }

  fclose(file);

  return REF_SUCCESS;
}